

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateUntagVar
          (Lowerer *this,RegOpnd *opnd,LabelInstr *labelFail,Instr *insertBeforeInstr,
          bool generateTagCheck)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  undefined4 *puVar5;
  IntConstOpnd *src;
  byte local_51;
  RegOpnd *regOpnd;
  IntConstOpnd *constOpnd;
  int32 constValue;
  bool generateTagCheck_local;
  Instr *insertBeforeInstr_local;
  LabelInstr *labelFail_local;
  RegOpnd *opnd_local;
  Lowerer *this_local;
  
  bVar2 = IR::Opnd::IsVar(&opnd->super_Opnd);
  if (bVar2) {
    bVar2 = IR::Opnd::IsNotInt(&opnd->super_Opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x466e,"(!opnd->IsNotInt())",
                         "An opnd we know is not an int should not try to untag it as it will always fail"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = StackSym::IsIntConst(opnd->m_sym);
    if (bVar2) {
      iVar4 = StackSym::GetIntConstValue(opnd->m_sym);
      src = IR::IntConstOpnd::New((long)iVar4,TyInt32,this->m_func,false);
      this_local = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
      InsertMove((Opnd *)this_local,&src->super_Opnd,insertBeforeInstr,true);
    }
    else {
      local_51 = 0;
      if (generateTagCheck) {
        bVar2 = IR::Opnd::IsTaggedInt(&opnd->super_Opnd);
        local_51 = bVar2 ^ 0xff;
      }
      this_local = (Lowerer *)
                   LowererMD::GenerateUntagVar
                             (&this->m_lowererMD,opnd,labelFail,insertBeforeInstr,
                              (bool)(local_51 & 1));
    }
  }
  else {
    iVar3 = IR::Opnd::GetSize(&opnd->super_Opnd);
    this_local = (Lowerer *)opnd;
    if (iVar3 != 4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x466b,"(opnd->GetSize() == 4)","This should be 32-bit wide");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return (RegOpnd *)this_local;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateUntagVar(IR::RegOpnd * opnd, IR::LabelInstr * labelFail, IR::Instr * insertBeforeInstr, bool generateTagCheck)
{
    if (!opnd->IsVar())
    {
        AssertMsg(opnd->GetSize() == 4, "This should be 32-bit wide");
        return opnd;
    }
    AssertMsg(!opnd->IsNotInt(), "An opnd we know is not an int should not try to untag it as it will always fail");
    if (opnd->m_sym->IsIntConst())
    {
        int32 constValue = opnd->m_sym->GetIntConstValue();
        IR::IntConstOpnd* constOpnd = IR::IntConstOpnd::New(constValue, TyInt32, this->m_func);
        IR::RegOpnd* regOpnd = IR::RegOpnd::New(TyInt32, this->m_func);
        InsertMove(regOpnd, constOpnd, insertBeforeInstr);
        return regOpnd;
    }
    return m_lowererMD.GenerateUntagVar(opnd, labelFail, insertBeforeInstr, generateTagCheck && !opnd->IsTaggedInt());
}